

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  DataSegmentModuleField *pDVar1;
  bool bVar2;
  Result RVar3;
  reference pvVar4;
  char *pcVar5;
  DataSegmentModuleField *pDVar6;
  ExprList *this_00;
  Enum EVar7;
  undefined1 auStack_138 [8];
  ModuleFieldList export_fields;
  Location loc;
  string name;
  Var local_d0;
  Location local_88;
  long *local_60;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_58;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_50;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_48;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_40;
  DataSegmentModuleField *local_38;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ != Error) {
    GetLocation((Location *)&export_fields.size_,this);
    RVar3 = Expect(this,Memory);
    if (RVar3.enum_ != Error) {
      loc.field_1._8_8_ = &name._M_string_length;
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length._0_1_ = 0;
      ParseBindVarOpt(this,(string *)((long)&loc.field_1 + 8));
      auStack_138 = (undefined1  [8])0x0;
      export_fields.first_ = (ModuleField *)0x0;
      export_fields.last_ = (ModuleField *)0x0;
      RVar3 = ParseInlineExports(this,(ModuleFieldList *)auStack_138,Memory);
      EVar7 = Error;
      if (RVar3.enum_ != Error) {
        bVar2 = PeekMatchLpar(this,Import);
        if (bVar2) {
          CheckImportOrdering(this,module);
          MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
                    ((wabt *)&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&loc.field_1 + 8));
          RVar3 = ParseInlineImport(this,(Import *)local_88.filename.data_);
          if ((RVar3.enum_ == Error) ||
             (RVar3 = ParseLimits(this,(Limits *)
                                       ((long)&(((Import *)((long)local_88.filename.data_ + 0x50))->
                                               module_name).field_2 + 8)), RVar3.enum_ == Error)) {
            if ((Import *)local_88.filename.data_ != (Import *)0x0) {
              (*(*(_func_int ***)local_88.filename.data_)[1])();
            }
            goto LAB_00da84b0;
          }
          GetLocation(&local_d0.loc,this);
          MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                    ((wabt *)&local_38,
                     (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                     &local_88,&local_d0.loc);
          local_58._M_head_impl = (ImportModuleField *)local_38;
          local_38 = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                      *)&local_58);
          if ((DataSegmentModuleField *)local_58._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &(local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>)->
              super_ModuleField)._vptr_ModuleField[1])();
          }
          local_58._M_head_impl = (ImportModuleField *)0x0;
          if (local_38 != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &local_38->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
              _vptr_ModuleField[1])();
          }
          if ((Import *)local_88.filename.data_ != (Import *)0x0) {
            (*(*(_func_int ***)local_88.filename.data_)[1])();
          }
        }
        else {
          bVar2 = MatchLpar(this,Data);
          if (bVar2) {
            MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>
                      ((wabt *)&local_38,(Location *)&export_fields.size_);
            pDVar1 = local_38;
            local_88.field_1.field_0.line = 0;
            local_88.field_1._4_8_ = 0;
            local_88.filename.data_ = (char *)0x0;
            local_88.filename.size_._0_4_ = 0;
            local_88.filename.size_._4_4_ = 0;
            Var::Var(&local_d0,
                     (Index)((ulong)((long)(module->memories).
                                           super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(module->memories).
                                          super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_88
                    );
            Var::operator=(&(pDVar1->data_segment).memory_var,&local_d0);
            Var::~Var(&local_d0);
            local_88.field_1.field_0.line = 0;
            local_88.field_1._4_8_ = 0;
            local_88.filename.data_ = (char *)0x0;
            local_88.filename.size_._0_4_ = 0;
            local_88.filename.size_._4_4_ = 0;
            Const::Const((Const *)&local_d0,0);
            MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_60,(Const *)&local_d0);
            name.field_2._8_8_ = local_60;
            local_60 = (long *)0x0;
            this_00 = &(pDVar1->data_segment).offset;
            intrusive_list<wabt::Expr>::push_back
                      (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                               ((long)&name.field_2 + 8));
            if (name.field_2._8_8_ != 0) {
              (**(code **)(*(long *)name.field_2._8_8_ + 8))();
            }
            name.field_2._8_8_ = 0;
            if (local_60 != (long *)0x0) {
              (**(code **)(*local_60 + 8))();
            }
            pvVar4 = intrusive_list<wabt::Expr>::back(this_00);
            (pvVar4->loc).filename.data_ = (char *)export_fields.size_;
            (pvVar4->loc).filename.size_ = (size_type)loc.filename.data_;
            (pvVar4->loc).field_1.field_1.offset = loc.filename.size_;
            ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
            ((long)&(pvVar4->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
            ParseTextListOpt(this,&(pDVar1->data_segment).data);
            RVar3 = Expect(this,Rpar);
            pDVar6 = local_38;
            if (RVar3.enum_ != Error) {
              MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                        ((wabt *)&local_d0,(Location *)&export_fields.size_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&loc.field_1 + 8));
              pcVar5 = (char *)(ulong)((*(int *)&(pDVar1->data_segment).data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                       *(int *)&(pDVar1->data_segment).data.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start) + 0xffffU
                                      >> 0x10);
              (((DataSegment *)((long)local_d0.loc.filename.data_ + 0x40))->memory_var).loc.filename
              .data_ = pcVar5;
              (((DataSegment *)((long)local_d0.loc.filename.data_ + 0x40))->memory_var).loc.filename
              .size_ = (size_type)pcVar5;
              (((DataSegment *)((long)local_d0.loc.filename.data_ + 0x40))->memory_var).loc.field_1.
              field2[0] = true;
              local_50._M_head_impl = (MemoryModuleField *)local_d0.loc.filename.data_;
              local_d0.loc.filename.data_ = (char *)0x0;
              Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                          *)&local_50);
              if (local_50._M_head_impl != (MemoryModuleField *)0x0) {
                (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                  super_ModuleField._vptr_ModuleField[1])();
              }
              local_50._M_head_impl = (MemoryModuleField *)0x0;
              local_48._M_head_impl = local_38;
              local_38 = (DataSegmentModuleField *)0x0;
              Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                          *)&local_48);
              if (local_48._M_head_impl != (DataSegmentModuleField *)0x0) {
                (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
                   &(local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->
                  super_ModuleField)._vptr_ModuleField[1])();
              }
              local_48._M_head_impl = (DataSegmentModuleField *)0x0;
              pDVar6 = local_38;
              if ((DataSegmentModuleField *)local_d0.loc.filename.data_ !=
                  (DataSegmentModuleField *)0x0) {
                (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)local_d0.loc.filename.data_)->
                  super_ModuleField)._vptr_ModuleField[1])();
                pDVar6 = local_38;
              }
            }
          }
          else {
            MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                      ((wabt *)&local_d0,(Location *)&export_fields.size_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&loc.field_1 + 8));
            RVar3 = ParseLimits(this,(Limits *)
                                     &((DataSegment *)((long)local_d0.loc.filename.data_ + 0x40))->
                                      memory_var);
            pDVar6 = (DataSegmentModuleField *)local_d0.loc.filename.data_;
            if (RVar3.enum_ != Error) {
              local_40._M_head_impl = (MemoryModuleField *)local_d0.loc.filename.data_;
              local_d0.loc.filename.data_ = (char *)0x0;
              Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                          *)&local_40);
              if ((DataSegmentModuleField *)local_40._M_head_impl != (DataSegmentModuleField *)0x0)
              {
                (*((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                  super_ModuleField._vptr_ModuleField[1])();
              }
              local_40._M_head_impl = (MemoryModuleField *)0x0;
              pDVar6 = (DataSegmentModuleField *)local_d0.loc.filename.data_;
            }
          }
          if (pDVar6 != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &pDVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
              _vptr_ModuleField[1])();
          }
          if (RVar3.enum_ == Error) goto LAB_00da84b0;
        }
        anon_unknown_1::AppendInlineExportFields
                  (module,(ModuleFieldList *)auStack_138,
                   (int)((ulong)((long)(module->memories).
                                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->memories).
                                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar3 = Expect(this,Rpar);
        EVar7 = (Enum)(RVar3.enum_ == Error);
      }
LAB_00da84b0:
      intrusive_list<wabt::ModuleField>::clear((intrusive_list<wabt::ModuleField> *)auStack_138);
      std::__cxx11::string::~string((string *)(loc.field_1.field2 + 8));
      return (Result)EVar7;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (MatchLpar(TokenType::Data)) {
    auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
    DataSegment& data_segment = data_segment_field->data_segment;
    data_segment.memory_var = Var(module->memories.size());
    data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    data_segment.offset.back().loc = loc;
    ParseTextListOpt(&data_segment.data);
    EXPECT(Rpar);

    auto memory_field = MakeUnique<MemoryModuleField>(loc, name);
    uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
    uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
    memory_field->memory.page_limits.initial = page_size;
    memory_field->memory.page_limits.max = page_size;
    memory_field->memory.page_limits.has_max = true;

    module->AppendField(std::move(memory_field));
    module->AppendField(std::move(data_segment_field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->memory.page_limits));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}